

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

int opj_j2k_get_default_thread_count(void)

{
  OPJ_BOOL OVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  int iVar4;
  
  __s1 = getenv("OPJ_NUM_THREADS");
  iVar4 = 0;
  if ((__s1 != (char *)0x0) && (OVar1 = opj_has_thread_support(), iVar4 = 0, OVar1 != 0)) {
    iVar2 = opj_get_num_cpus();
    iVar3 = strcmp(__s1,"ALL_CPUS");
    iVar4 = iVar2;
    if ((iVar3 != 0) && (iVar3 = atoi(__s1), iVar4 = 0, -1 < iVar3)) {
      iVar4 = 0x40;
      if (iVar2 != 0) {
        iVar4 = iVar2 * 2;
      }
      if (iVar3 < iVar4) {
        iVar4 = iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

static int opj_j2k_get_default_thread_count()
{
    const char* num_threads_str = getenv("OPJ_NUM_THREADS");
    int num_cpus;
    int num_threads;

    if (num_threads_str == NULL || !opj_has_thread_support()) {
        return 0;
    }
    num_cpus = opj_get_num_cpus();
    if (strcmp(num_threads_str, "ALL_CPUS") == 0) {
        return num_cpus;
    }
    if (num_cpus == 0) {
        num_cpus = 32;
    }
    num_threads = atoi(num_threads_str);
    if (num_threads < 0) {
        num_threads = 0;
    } else if (num_threads > 2 * num_cpus) {
        num_threads = 2 * num_cpus;
    }
    return num_threads;
}